

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireHandWithTwoCardsTest_tryAddCardOnTableauPileWithFail_Test::TestBody
          (SolitaireHandWithTwoCardsTest_tryAddCardOnTableauPileWithFail_Test *this)

{
  FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_00;
  TableauPileMock *pTVar1;
  Solitaire *this_01;
  char *message;
  Cards cardsToAdd;
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  local_90;
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  local_70;
  char local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_48;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_30;
  PileId local_14;
  
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_30,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  pTVar1 = (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
           super_SolitaireTest.lastTableauPileMock;
  this_00 = &pTVar1->gmock00_createSnapshot_13;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,pTVar1);
  local_90.function_mocker_ =
       (FunctionMocker<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
        *)this_00;
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::InternalExpectedAt
            ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
              *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x211,"lastTableauPileMock","createSnapshot()");
  pTVar1 = (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
           super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  Matcher((Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&> *
          )&local_70,&local_30);
  piles::TableauPileMock::gmock_tryAddCards
            (&local_90,pTVar1,
             (Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
              *)&local_70);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>::
  InternalExpectedAt(&local_90,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                     ,0x212,"lastTableauPileMock","tryAddCards(cardsToAdd)");
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase((MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                *)&local_90.matchers_);
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase(&local_70);
  this_01 = &(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.solitaire;
  local_14.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryAddCardsOnTableauPile(this_01,&local_14);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_90,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_48,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_90);
  if (local_90.function_mocker_ !=
      (FunctionMocker<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
       *)0x0) {
    operator_delete(local_90.function_mocker_,
                    (long)local_90.matchers_.
                          super__Tuple_impl<0UL,_testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>_>
                          .
                          super__Head_base<0UL,_testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>,_false>
                          ._M_head_impl.
                          super_MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                          .vtable_ - (long)local_90.function_mocker_);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_90,
             &local_48);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_70,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_90);
  if (local_90.function_mocker_ !=
      (FunctionMocker<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
       *)0x0) {
    operator_delete(local_90.function_mocker_,
                    (long)local_90.matchers_.
                          super__Tuple_impl<0UL,_testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>_>
                          .
                          super__Head_base<0UL,_testing::Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>,_false>
                          ._M_head_impl.
                          super_MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                          .vtable_ - (long)local_90.function_mocker_);
  }
  Solitaire::getCardsInHand(this_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_58,(char *)&local_70,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  if (local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface != (_func_int **)0x0)
  {
    operator_delete(local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface,
                    (long)local_70.buffer_.ptr -
                    (long)local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  if (local_48.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x215,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_90.function_mocker_ !=
        (FunctionMocker<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
         *)0x0) {
      (*((local_90.function_mocker_)->super_UntypedFunctionMockerBase).
        _vptr_UntypedFunctionMockerBase[1])();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (local_30.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(SolitaireHandWithTwoCardsTest, tryAddCardOnTableauPileWithFail) {
    auto cardsToAdd {twoCards};

    EXPECT_CALL(lastTableauPileMock, createSnapshot());
    EXPECT_CALL(lastTableauPileMock, tryAddCards(cardsToAdd));

    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(twoCards));
}